

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

ssize_t __thiscall blc::network::Socket::write(Socket *this,int __fd,void *__buf,size_t __n)

{
  int __fd_00;
  undefined8 uVar1;
  void *__buf_00;
  size_t __n_00;
  ssize_t sVar2;
  int *piVar3;
  undefined4 in_register_00000034;
  string *in_stack_00000128;
  exception *in_stack_00000130;
  allocator<char> *in_stack_ffffffffffffff80;
  allocator<char> *__a;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff97;
  allocator<char> local_31 [33];
  undefined8 local_10;
  Socket *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  if ((this->_opened & 1U) == 0) {
    uVar1 = __cxa_allocate_exception(0x78);
    __a = local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff97,
                        CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),(char *)this,
               __a);
    error::exception::exception(in_stack_00000130,in_stack_00000128);
    __cxa_throw(uVar1,&error::exception::typeinfo,error::exception::~exception);
  }
  __fd_00 = this->_socket;
  __buf_00 = (void *)std::__cxx11::string::c_str();
  __n_00 = std::__cxx11::string::size();
  sVar2 = send(__fd_00,__buf_00,__n_00,0x4000);
  if (sVar2 == -1) {
    uVar4 = 1;
    uVar1 = __cxa_allocate_exception(0x78);
    piVar3 = __errno_location();
    strerror(*piVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff97,CONCAT16(uVar4,in_stack_ffffffffffffff90)),
               (char *)this,in_stack_ffffffffffffff80);
    error::exception::exception(in_stack_00000130,in_stack_00000128);
    __cxa_throw(uVar1,&error::exception::typeinfo,error::exception::~exception);
  }
  return sVar2;
}

Assistant:

void blc::network::Socket::write(const std::string &request) const {
	if (this->_opened == false)
		throw blc::error::exception("not opened");
	if (::send(this->_socket, request.c_str(), request.size(), MSG_NOSIGNAL) == -1)
		throw blc::error::exception(strerror(errno));
}